

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall FInterpolator::ClearInterpolations(FInterpolator *this)

{
  DInterpolation *pDVar1;
  DInterpolation *pDVar2;
  
  pDVar2 = (this->Head).field_0.p;
  if ((pDVar2 == (DInterpolation *)0x0) || (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->Head).field_0.p = (DInterpolation *)0x0;
  }
  else {
    (this->Head).field_0.p = (DInterpolation *)0x0;
    do {
      pDVar1 = (pDVar2->Next).field_0.p;
      if ((pDVar1 == (DInterpolation *)0x0) || (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0))
      {
        pDVar1 = (DInterpolation *)0x0;
      }
      (pDVar2->Next).field_0.p = (DInterpolation *)0x0;
      (pDVar2->Prev).field_0.p = (DInterpolation *)0x0;
      (*(pDVar2->super_DObject)._vptr_DObject[4])();
      pDVar2 = pDVar1;
    } while (pDVar1 != (DInterpolation *)0x0);
  }
  return;
}

Assistant:

void FInterpolator::ClearInterpolations()
{
	DInterpolation *probe = Head;
	Head = NULL;
	while (probe != NULL)
	{
		DInterpolation *next = probe->Next;
		probe->Next = probe->Prev = NULL;
		probe->Destroy();
		probe = next;
	}
}